

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void processCompileOptionsInternal
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *options,
               hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *uniqueOptions,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugOptions,char *logName,string *language)

{
  pointer ppTVar1;
  char *pcVar2;
  cmake *this;
  pointer __obj;
  allocator local_1ba;
  allocator local_1b9;
  cmGeneratorTarget *local_1b8;
  pointer local_1b0;
  string usedOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryOptions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  cmListFileBacktrace local_70;
  
  ppTVar1 = (entries->
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_1b8 = tgt;
  for (local_1b0 = (entries->
                   super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; local_1b0 != ppTVar1;
      local_1b0 = local_1b0 + 1) {
    entryOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    entryOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    entryOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pcVar2 = cmCompiledGeneratorExpression::Evaluate
                       (((*local_1b0)->ge).x_,local_1b8->LocalGenerator,config,false,local_1b8,
                        dagChecker,language);
    std::__cxx11::string::string((string *)&local_70,pcVar2,(allocator *)&usedOptions);
    cmSystemTools::ExpandListArgument((string *)&local_70,&entryOptions,false);
    std::__cxx11::string::~string((string *)&local_70);
    usedOptions._M_dataplus._M_p = (pointer)&usedOptions.field_2;
    usedOptions._M_string_length = 0;
    usedOptions.field_2._M_local_buf[0] = '\0';
    for (__obj = entryOptions.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __obj != entryOptions.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __obj = __obj + 1) {
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)&local_70,uniqueOptions,__obj);
      if (local_70.Context.Name.field_2._M_local_buf[0] == '\x01') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(options,__obj);
        if (debugOptions) {
          std::operator+(&local_90," * ",__obj);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_70,&local_90,"\n");
          std::__cxx11::string::append((string *)&usedOptions);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
        }
      }
    }
    if (usedOptions._M_string_length != 0) {
      this = cmLocalGenerator::GetCMakeInstance(local_1b8->LocalGenerator);
      std::__cxx11::string::string((string *)&local_110,"Used compile ",&local_1b9);
      std::operator+(&local_150,&local_110,logName);
      std::__cxx11::string::string((string *)&local_130," for target ",&local_1ba);
      std::operator+(&local_f0,&local_150,&local_130);
      std::operator+(&local_d0,&local_f0,&local_1b8->Target->Name);
      std::operator+(&local_b0,&local_d0,":\n");
      std::operator+(&local_90,&local_b0,&usedOptions);
      cmListFileBacktrace::cmListFileBacktrace(&local_70,&(((*local_1b0)->ge).x_)->Backtrace);
      cmake::IssueMessage(this,LOG,&local_90,&local_70,false);
      cmListFileBacktrace::~cmListFileBacktrace(&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_110);
    }
    std::__cxx11::string::~string((string *)&usedOptions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&entryOptions);
  }
  return;
}

Assistant:

static void processCompileOptionsInternal(cmGeneratorTarget const* tgt,
      const std::vector<cmGeneratorTarget::TargetPropertyEntry*> &entries,
      std::vector<std::string> &options,
      UNORDERED_SET<std::string> &uniqueOptions,
      cmGeneratorExpressionDAGChecker *dagChecker,
      const std::string& config, bool debugOptions, const char *logName,
      std::string const& language)
{
  for (std::vector<cmGeneratorTarget::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    std::vector<std::string> entryOptions;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(
                                        tgt->GetLocalGenerator(),
                                              config,
                                              false,
                                              tgt,
                                              dagChecker,
                                              language),
                                    entryOptions);
    std::string usedOptions;
    for(std::vector<std::string>::iterator
          li = entryOptions.begin(); li != entryOptions.end(); ++li)
      {
      std::string const& opt = *li;

      if(uniqueOptions.insert(opt).second)
        {
        options.push_back(opt);
        if (debugOptions)
          {
          usedOptions += " * " + opt + "\n";
          }
        }
      }
    if (!usedOptions.empty())
      {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used compile ") + logName
                            + std::string(" for target ")
                            + tgt->GetName() + ":\n"
                            + usedOptions, (*it)->ge->GetBacktrace());
      }
    }
}